

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkBase.cpp
# Opt level: O1

void __thiscall chrono::ChLinkBase::ArchiveIN(ChLinkBase *this,ChArchiveIn *marchive)

{
  char *local_38;
  undefined1 *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChLinkBase>(marchive);
  ChPhysicsItem::ArchiveIN(&this->super_ChPhysicsItem,marchive);
  local_30 = &(this->super_ChPhysicsItem).field_0x74;
  local_38 = "disabled";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  local_30 = &(this->super_ChPhysicsItem).field_0x75;
  local_38 = "valid";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  local_30 = &(this->super_ChPhysicsItem).field_0x76;
  local_38 = "broken";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  return;
}

Assistant:

void ChLinkBase::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkBase>();

    // deserialize parent class
    ChPhysicsItem::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(disabled);
    marchive >> CHNVP(valid);
    marchive >> CHNVP(broken);
}